

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  int iVar3;
  void *a;
  FILE *__s;
  uint8_t *__ptr;
  uint64_t __size;
  char cVar4;
  char cVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  bool bVar15;
  bool bVar16;
  uint32_t nr_of_triangles;
  uint32_t nr_of_vertices;
  int local_490;
  int local_48c;
  uint32_t *triangles;
  float *vertices;
  int local_478;
  int local_474;
  int local_470;
  int local_46c;
  uint16_t *attributes;
  float *texcoords;
  uint32_t *vertex_colors;
  float *vertex_normals;
  float *triangle_normals;
  undefined8 local_440;
  char new_filename [1024];
  
  if (argc < 3) {
    puts("Usage: trico_encoder -i <input> [options]\n");
    puts("Options:");
    puts("  -i <input>           input file name of type binary stl or binary/ascii ply.");
    puts("  -o <output>          output file name.");
    puts("  -stladd <attribute>  add a given stl attribute (normal, uint16).");
    puts("  -plyskip <attribute> skip a given ply attribute (normal, tex_coord, color).");
    putchar(10);
    return -1;
  }
  iVar3 = argc + -1;
  iVar14 = 1;
  local_440 = (char *)0x0;
  local_490 = 0;
  local_48c = 0;
  local_46c = 0;
  local_478 = 0;
  local_470 = 0;
  local_474 = 0;
  do {
    pcVar11 = argv[iVar14];
    if (*pcVar11 == '-') {
      if ((pcVar11[1] == 'i') && (pcVar11[2] == '\0')) {
        if (iVar14 == iVar3) {
          pcVar11 = "I expect a filename after command -i";
          goto LAB_0010c41a;
        }
        local_440 = argv[(long)iVar14 + 1];
      }
      else {
        if ((pcVar11[1] != 'o') || (pcVar11[2] != '\0')) goto LAB_0010bd4f;
        if (iVar14 == iVar3) {
          pcVar11 = "I expect a filename after command -o";
          goto LAB_0010c41a;
        }
        pcVar11 = argv[(long)iVar14 + 1];
        cVar4 = *pcVar11;
        if (cVar4 == '\0') {
          uVar6 = 0;
        }
        else {
          uVar6 = 0;
          do {
            new_filename[uVar6] = cVar4;
            cVar4 = pcVar11[uVar6 + 1];
            uVar6 = uVar6 + 1;
          } while (cVar4 != '\0');
          uVar6 = uVar6 & 0xffffffff;
        }
        new_filename[uVar6] = '\0';
        local_474 = 1;
      }
    }
    else {
LAB_0010bd4f:
      iVar2 = strcmp(pcVar11,"-stladd");
      if (iVar2 == 0) {
        if (iVar14 == iVar3) {
          pcVar11 = "I expect an attribute after command -stladd";
          goto LAB_0010c41a;
        }
        pcVar11 = argv[(long)iVar14 + 1];
        iVar2 = strcmp(pcVar11,"normal");
        if (iVar2 == 0) {
          local_470 = 1;
        }
        else {
          iVar2 = strcmp(pcVar11,"tex_coord");
          if (iVar2 != 0) {
            iVar2 = strcmp(pcVar11,"color");
            local_46c = 1;
            goto LAB_0010be04;
          }
          local_478 = 1;
        }
      }
      else {
        iVar2 = strcmp(pcVar11,"-plyskip");
        if (iVar2 != 0) {
          pcVar10 = "Unknown command %s\n";
          goto LAB_0010beeb;
        }
        if (iVar14 == iVar3) {
          pcVar11 = "I expect an attribute after command -plyskip";
          goto LAB_0010c41a;
        }
        pcVar11 = argv[(long)iVar14 + 1];
        iVar2 = strcmp(pcVar11,"normal");
        if (iVar2 == 0) {
          local_490 = 1;
        }
        else {
          iVar2 = strcmp(pcVar11,"uint16");
          local_48c = 1;
LAB_0010be04:
          if (iVar2 != 0) {
            pcVar10 = "Unknown attribute %s\n";
            goto LAB_0010beeb;
          }
        }
      }
    }
    pcVar11 = local_440;
    iVar14 = iVar14 + 2;
  } while (iVar14 < argc);
  if (local_440 == (char *)0x0) {
    pcVar11 = "An input file name is required";
    goto LAB_0010c41a;
  }
  if (local_474 == 0) {
    uVar6 = 0;
    cVar4 = *local_440;
    while (cVar4 != '\0') {
      new_filename[uVar6] = cVar4;
      lVar7 = uVar6 + 1;
      uVar6 = uVar6 + 1;
      cVar4 = local_440[lVar7];
    }
    lVar8 = (long)(int)uVar6 * -0x100000000;
    lVar7 = (long)(int)uVar6;
    do {
      lVar13 = lVar8;
      if (lVar7 + -1 == 0) break;
      lVar1 = lVar7 + -1;
      lVar8 = lVar13 + 0x100000000;
      lVar7 = lVar7 + -1;
    } while (new_filename[lVar1] != '.');
    if (new_filename[-0x100000000 - lVar13 >> 0x20] == '.') {
      lVar7 = -lVar13 >> 0x20;
      pcVar10 = new_filename + lVar7 + 3;
      (new_filename + lVar7)[0] = 't';
      (new_filename + lVar7)[1] = 'r';
      new_filename[lVar7 + 2] = 'c';
    }
    else {
      pcVar10 = new_filename + (uVar6 & 0xffffffff) + 4;
      builtin_strncpy(new_filename + (uVar6 & 0xffffffff),".trc",4);
    }
    *pcVar10 = '\0';
  }
  uVar6 = 0;
  cVar5 = *local_440;
  cVar4 = cVar5;
  while (cVar4 != '\0') {
    lVar7 = uVar6 + 1;
    uVar6 = uVar6 + 1;
    cVar4 = local_440[lVar7];
  }
  lVar7 = (long)(int)uVar6;
  lVar8 = lVar7 * -0x100000000;
  uVar9 = uVar6 & 0xffffffff;
  do {
    lVar7 = lVar7 + -1;
    if (lVar7 == 0) {
      uVar12 = 0;
      lVar7 = 1;
      cVar4 = cVar5;
      goto LAB_0010bfd4;
    }
    lVar8 = lVar8 + 0x100000000;
    uVar12 = (int)uVar9 - 1;
    uVar9 = (ulong)uVar12;
  } while (local_440[lVar7] != '.');
  lVar7 = 0x100000000 - lVar8 >> 0x20;
  cVar4 = local_440[-lVar8 >> 0x20];
LAB_0010bfd4:
  uVar9 = 0;
  if (cVar4 == '.') {
    bVar15 = false;
    if ((int)uVar6 - uVar12 == 4) {
      if (((byte)(local_440[lVar7] | 0x20U) != 0x73) ||
         ((byte)(local_440[lVar7 + 1] | 0x20U) != 0x74)) goto LAB_0010c018;
      bVar15 = (local_440[lVar7 + 2] + 0xb4U & 0xdf) == 0;
    }
  }
  else {
LAB_0010c018:
    bVar15 = false;
  }
  if (cVar5 != '\0') {
    uVar9 = 0;
    do {
      lVar7 = uVar9 + 1;
      uVar9 = uVar9 + 1;
    } while (local_440[lVar7] != '\0');
  }
  lVar7 = (long)(int)uVar9;
  lVar8 = lVar7 * -0x100000000;
  uVar6 = uVar9 & 0xffffffff;
  bVar16 = false;
  do {
    lVar7 = lVar7 + -1;
    if (lVar7 == 0) {
      lVar7 = 1;
      uVar12 = 0;
      goto LAB_0010c06c;
    }
    lVar8 = lVar8 + 0x100000000;
    uVar12 = (int)uVar6 - 1;
    uVar6 = (ulong)uVar12;
  } while (local_440[lVar7] != '.');
  cVar5 = local_440[-lVar8 >> 0x20];
  lVar7 = 0x100000000 - lVar8 >> 0x20;
LAB_0010c06c:
  if ((((cVar5 == '.') && ((int)uVar9 - uVar12 == 4)) && ((byte)(local_440[lVar7] | 0x20U) == 0x70))
     && ((byte)(local_440[lVar7 + 1] | 0x20U) == 0x6c)) {
    bVar16 = (local_440[lVar7 + 2] + 0xa7U & 0xdf) == 0;
  }
  if (bVar16 || bVar15) {
    nr_of_vertices = 0;
    vertices = (float *)0x0;
    triangle_normals = (float *)0x0;
    vertex_normals = (float *)0x0;
    vertex_colors = (uint32_t *)0x0;
    nr_of_triangles = 0;
    triangles = (uint32_t *)0x0;
    texcoords = (float *)0x0;
    attributes = (uint16_t *)0x0;
    if (bVar15) {
      if (local_490 == 0 && local_48c == 0) {
        iVar3 = trico_read_stl(&nr_of_vertices,&vertices,&nr_of_triangles,&triangles,local_440);
      }
      else {
        iVar3 = trico_read_stl_full(&nr_of_vertices,&vertices,&nr_of_triangles,&triangles,
                                    &triangle_normals,&attributes,local_440);
      }
      if (iVar3 != 1) {
        pcVar10 = "Not a valid stl file: %s\n";
        goto LAB_0010beeb;
      }
    }
    if ((bVar16) &&
       (iVar3 = trico_read_ply(&nr_of_vertices,&vertices,&vertex_normals,&vertex_colors,
                               &nr_of_triangles,&triangles,&texcoords,pcVar11), iVar3 != 1)) {
      pcVar10 = "Not a valid ply file: %s\n";
LAB_0010beeb:
      printf(pcVar10,pcVar11);
      return -1;
    }
    a = trico_open_archive_for_writing(0x100000);
    if ((vertices == (float *)0x0 || nr_of_vertices == 0) ||
       (iVar3 = trico_write_vertices(a,vertices,nr_of_vertices), iVar3 != 0)) {
      if ((triangles == (uint32_t *)0x0 || nr_of_triangles == 0) ||
         (iVar3 = trico_write_triangles(a,triangles,nr_of_triangles), iVar3 != 0)) {
        if (((bool)(local_490 != 0 & bVar15)) &&
           ((triangle_normals != (float *)0x0 && nr_of_triangles != 0 &&
            (iVar3 = trico_write_triangle_normals(a,triangle_normals,nr_of_triangles), iVar3 == 0)))
           ) {
          pcVar11 = "Something went wrong when writing the triangle normals";
        }
        else if (((bool)(bVar15 & local_48c != 0)) &&
                ((attributes != (uint16_t *)0x0 && nr_of_triangles != 0 &&
                 (iVar3 = trico_write_attributes_uint16(a,attributes,nr_of_triangles), iVar3 == 0)))
                ) {
          pcVar11 = "Something went wrong when writing the uint16 attributes";
        }
        else if ((local_470 == 0 && bVar16) &&
                ((vertex_normals != (float *)0x0 && nr_of_vertices != 0 &&
                 (iVar3 = trico_write_vertex_normals(a,vertex_normals,nr_of_vertices), iVar3 == 0)))
                ) {
          pcVar11 = "Something went wrong when writing the vertex normals";
        }
        else if ((local_46c == 0 && bVar16) &&
                ((vertex_colors != (uint32_t *)0x0 && nr_of_vertices != 0 &&
                 (iVar3 = trico_write_vertex_colors(a,vertex_colors,nr_of_vertices), iVar3 == 0))))
        {
          pcVar11 = "Something went wrong when writing the vertex colors";
        }
        else {
          if ((local_478 != 0 || !bVar16) ||
             ((texcoords == (float *)0x0 || nr_of_triangles == 0 ||
              (iVar3 = trico_write_uv_per_triangle(a,texcoords,nr_of_triangles), iVar3 != 0)))) {
            free(vertices);
            free(vertex_normals);
            free(vertex_colors);
            free(triangles);
            free(texcoords);
            free(triangle_normals);
            free(attributes);
            __s = fopen(new_filename,"wb");
            if (__s != (FILE *)0x0) {
              __ptr = trico_get_buffer_pointer(a);
              __size = trico_get_size(a);
              fwrite(__ptr,__size,1,__s);
              fclose(__s);
              trico_close_archive(a);
              return 0;
            }
            pcVar10 = "Cannot write to file %s\n";
            pcVar11 = new_filename;
            goto LAB_0010beeb;
          }
          pcVar11 = "Something went wrong when writing the texture coordinates";
        }
      }
      else {
        pcVar11 = "Something went wrong when writing the triangles";
      }
    }
    else {
      pcVar11 = "Something went wrong when writing the vertices";
    }
  }
  else {
    pcVar11 = "I expect the input file to be of type stl or ply.";
  }
LAB_0010c41a:
  puts(pcVar11);
  return -1;
}

Assistant:

int main(int argc, const char** argv)
  {
  if (argc < 3)
    {
    print_help();
    return -1;
    }
  const char* filename = NULL;
  char new_filename[1024];
  int include_stl_normals = 0;
  int include_stl_uint16 = 0;
  int output_filename = 0;
  int skip_ply_normals = 0;
  int skip_ply_texcoords = 0;
  int skip_ply_color = 0;

  for (int j = 1; j < argc; ++j)
    {
    if (strcmp(argv[j], "-i") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect a filename after command -i\n");
        return -1;
        }
      ++j;
      filename = argv[j];
      }
    else if (strcmp(argv[j], "-o") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect a filename after command -o\n");
        return -1;
        }
      ++j;
      const char* ptr = argv[j];
      int idx = 0;
      while (*ptr)
        new_filename[idx++] = *ptr++;
      new_filename[idx] = 0;
      output_filename = 1;
      }      
    else if (strcmp(argv[j], "-stladd") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect an attribute after command -stladd\n");
        return -1;
        }
      ++j;
      if (strcmp(argv[j], "normal") == 0)
        {
        skip_ply_normals = 1;
        }
      else if (strcmp(argv[j], "tex_coord") == 0)
        {
        skip_ply_texcoords = 1;
        }
      else if (strcmp(argv[j], "color") == 0)
        {
        skip_ply_color = 1;
        }
      else
        {
        printf("Unknown attribute %s\n", argv[j]);
        return -1;
        }
      }
    else if (strcmp(argv[j], "-plyskip") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect an attribute after command -plyskip\n");
        return -1;
        }
      ++j;
      if (strcmp(argv[j], "normal") == 0)
        {
        include_stl_normals = 1;
        }
      else if (strcmp(argv[j], "uint16") == 0)
        {
        include_stl_uint16 = 1;
        }
      else
        {
        printf("Unknown attribute %s\n", argv[j]);
        return -1;
        }
      }
    else
      {
      printf("Unknown command %s\n", argv[j]);
      return -1;
      }
    }

  if (!filename)
    {
    printf("An input file name is required\n");
    return -1;
    }

  if (!output_filename)
    {
    change_extension_to_trc(new_filename, filename);
    }

  int is_stl = extension_is_stl(filename);
  int is_ply = extension_is_ply(filename);

  if (!is_stl && !is_ply)
    {
    printf("I expect the input file to be of type stl or ply.\n");
    return -1;
    }

  uint32_t nr_of_vertices = 0;
  float* vertices = NULL;
  float* triangle_normals = NULL;
  float* vertex_normals = NULL;
  uint32_t* vertex_colors = NULL;
  uint32_t nr_of_triangles = 0;
  uint32_t* triangles = NULL;
  float* texcoords = NULL;
  uint16_t* attributes = NULL;

  int read_successfully = 0;

  if (is_stl)
    {
    if (include_stl_normals || include_stl_uint16)
      read_successfully = trico_read_stl_full(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, &triangle_normals, &attributes, filename);
    else
      read_successfully = trico_read_stl(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, filename);
    if (read_successfully != 1)
      {
      printf("Not a valid stl file: %s\n", filename);
      return -1;
      }
    }
  if (is_ply)
    {
    read_successfully = trico_read_ply(&nr_of_vertices, &vertices, &vertex_normals, &vertex_colors, &nr_of_triangles, &triangles, &texcoords, filename);
    if (read_successfully != 1)
      {
      printf("Not a valid ply file: %s\n", filename);
      return -1;
      }
    }  

  void* arch = trico_open_archive_for_writing(1024 * 1024);
  if (nr_of_vertices && vertices && !trico_write_vertices(arch, vertices, nr_of_vertices))
    {
    printf("Something went wrong when writing the vertices\n");
    return -1;
    }
  if (nr_of_triangles && triangles && !trico_write_triangles(arch, triangles, nr_of_triangles))
    {
    printf("Something went wrong when writing the triangles\n");
    return -1;
    }
  if (is_stl && include_stl_normals)
    {
    if (nr_of_triangles && triangle_normals && !trico_write_triangle_normals(arch, triangle_normals, nr_of_triangles))
      {
      printf("Something went wrong when writing the triangle normals\n");
      return -1;
      }
    }
  if (is_stl && include_stl_uint16)
    {
    if (nr_of_triangles && attributes && !trico_write_attributes_uint16(arch, attributes, nr_of_triangles))
      {
      printf("Something went wrong when writing the uint16 attributes\n");
      return -1;
      }
    }
  if (is_ply && !skip_ply_normals)
    {
    if (nr_of_vertices && vertex_normals && !trico_write_vertex_normals(arch, vertex_normals, nr_of_vertices))
      {
      printf("Something went wrong when writing the vertex normals\n");
      return -1;
      }      
    }
  if (is_ply && !skip_ply_color)
    {
    if (nr_of_vertices && vertex_colors && !trico_write_vertex_colors(arch, vertex_colors, nr_of_vertices))
      {
      printf("Something went wrong when writing the vertex colors\n");
      return -1;
      }
    }
  if (is_ply && !skip_ply_texcoords)
    {
    if (nr_of_triangles && texcoords && !trico_write_uv_per_triangle(arch, texcoords, nr_of_triangles))
      {
      printf("Something went wrong when writing the texture coordinates\n");
      return -1;
      }
    }

  trico_free(vertices);
  trico_free(vertex_normals);
  trico_free(vertex_colors);
  trico_free(triangles);
  trico_free(texcoords);
  trico_free(triangle_normals);
  trico_free(attributes);

  FILE* f = fopen(new_filename, "wb");
  if (!f)
    {
    printf("Cannot write to file %s\n", new_filename);
    return -1;
    }

  fwrite((const void*)trico_get_buffer_pointer(arch), trico_get_size(arch), 1, f);
  fclose(f);

  trico_close_archive(arch);

  return 0;
  }